

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z2.c
# Opt level: O1

LispPTR N_OP_classoc(LispPTR key,LispPTR list)

{
  uint uVar1;
  LispPTR LVar2;
  cadr_cell cVar3;
  LispPTR cell_adr;
  ulong uVar4;
  
  uVar1 = key & 0xfff0000;
  if (uVar1 < 0xe0000) {
    if ((uVar1 != 0) && (uVar1 != 0x70000)) {
      MachineState.tosvalue = list;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
  }
  else if ((uVar1 != 0xf0000) && (uVar1 != 0xe0000)) {
    MachineState.tosvalue = list;
    MachineState.errorexit = 1;
    return 0xffffffff;
  }
  if (list == 0) {
    return 0;
  }
  if ((*(ushort *)((ulong)(list >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) == 5) {
    cVar3 = cadr(list);
    uVar4 = (ulong)cVar3 >> 0x20;
    while( true ) {
      if (((*(ushort *)((ulong)(cVar3._1_4_ & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) == 5) &&
         (LVar2 = car(cVar3.car_cell), LVar2 == key)) {
        return cVar3.car_cell;
      }
      cell_adr = (LispPTR)uVar4;
      LVar2 = 0;
      if ((*(ushort *)((ulong)((uint)(uVar4 >> 8) & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) == 5)
      {
        cVar3 = cadr(cell_adr);
        uVar4 = (ulong)cVar3 >> 0x20;
        LVar2 = cell_adr;
      }
      if (MachineState.irqend == 0) break;
      if (LVar2 == 0) {
        return 0;
      }
    }
    MachineState.errorexit = 1;
    MachineState.tosvalue = LVar2;
    return 0xfffffffe;
  }
  return 0;
}

Assistant:

LispPTR N_OP_classoc(LispPTR key, LispPTR list) {
  struct cadr_cell cadr1;
  LispPTR cdrcell; /* address of (cdr A-list); Lisp address */

  switch (key & SEGMASK) {
    case S_POSITIVE: break;
    case S_NEGATIVE: break;
    case S_CHARACTER: break;
    case ATOM_OFFSET: break;
    default: ERROR_EXIT(list);
  }
  /* JRB - Don Charnley claims the code below should be identical to the
        code in IL:ASSOC, so I copied my new and exciting version over */

  if (list == NIL_PTR) { return (NIL_PTR); }

  if (GetTypeNumber(list) != TYPE_LISTP) { return (NIL_PTR); }

  S_N_CHECKANDCADR(list, cadr1, list);

  do {
    cdrcell = cadr1.cdr_cell; /* the rest of A-list */
    if (Listp(cadr1.car_cell) && key == car(cadr1.car_cell)) {
      /* cons data found */
      return (cadr1.car_cell);
    }
    /* search the rest of A-list */
    if (Listp(cdrcell))
      cadr1 = cadr(cdrcell);
    else
      cdrcell = NIL;
    /* check for interrupts and punt to handle one safely */
    if (!Irq_Stk_End) {
      TopOfStack = cdrcell; /* for continuation */
      TIMER_EXIT(cdrcell);
    }
  } while (cdrcell != NIL_PTR);

  return (NIL_PTR);
}